

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_rsub>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  int local_9c;
  float *local_90;
  float *local_88;
  __m128 _outp;
  __m128 _b;
  __m128 _p;
  int i;
  binary_op_rsub op;
  int size_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  float fStack_20;
  float fStack_1c;
  
  local_90 = outptr;
  local_88 = ptr1;
  _outp._0_8_ = ptr;
  for (local_9c = 0; local_9c + 3 < size; local_9c = local_9c + 4) {
    ptr_local._0_4_ = (float)*(undefined8 *)local_88;
    ptr_local._4_4_ = (float)((ulong)*(undefined8 *)local_88 >> 0x20);
    fStack_20 = (float)*(undefined8 *)(local_88 + 2);
    fStack_1c = (float)((ulong)*(undefined8 *)(local_88 + 2) >> 0x20);
    outptr_local._0_4_ = (float)*(undefined8 *)_outp._0_8_;
    outptr_local._4_4_ = (float)((ulong)*(undefined8 *)_outp._0_8_ >> 0x20);
    ptr1_local._0_4_ = (float)*(undefined8 *)(_outp._0_8_ + 8);
    ptr1_local._4_4_ = (float)((ulong)*(undefined8 *)(_outp._0_8_ + 8) >> 0x20);
    *(ulong *)local_90 =
         CONCAT44(ptr_local._4_4_ - outptr_local._4_4_,ptr_local._0_4_ - outptr_local._0_4_);
    *(ulong *)(local_90 + 2) = CONCAT44(fStack_1c - ptr1_local._4_4_,fStack_20 - ptr1_local._0_4_);
    _outp._0_8_ = _outp._0_8_ + 0x10;
    local_88 = local_88 + 4;
    local_90 = local_90 + 4;
  }
  for (; local_9c < size; local_9c = local_9c + 1) {
    *local_90 = *local_88 - *(float *)_outp._0_8_;
    _outp._0_8_ = _outp._0_8_ + 4;
    local_88 = local_88 + 1;
    local_90 = local_90 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}